

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O3

void __thiscall TPZMHMeshControl::DivideWrap(TPZMHMeshControl *this,TPZGeoEl *wrapelement)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  TPZGeoEl *pTVar5;
  TPZAutoPointer<TPZRefPattern> *this_00;
  ulong uVar6;
  int iVar7;
  TPZAutoPointer<TPZRefPattern> siderefpattern_1;
  TPZGeoElSide neighbour;
  TPZGeoElSide gelside;
  TPZStack<TPZGeoEl_*,_10> subels;
  TPZStack<TPZGeoElSide,_10> subelsides;
  undefined1 local_220 [16];
  TPZGeoEl *local_210;
  int local_208;
  TPZGeoEl *local_200;
  TPZMHMeshControl *local_1f8;
  TPZAutoPointer<TPZRefPattern> local_1f0;
  TPZAutoPointer<TPZRefPattern> local_1e8;
  TPZGeoElSide local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  long local_1b8;
  _func_int **local_1b0;
  undefined1 local_1a8 [80];
  TPZGeoElSide local_158;
  TPZStack<TPZGeoElSide,_10> local_140;
  
  local_1f8 = this;
  local_1e0.fSide = (**(code **)(*(long *)wrapelement + 0xf0))(wrapelement);
  local_1e0.fSide = local_1e0.fSide + -1;
  local_1e0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
  local_1e0.fGeoEl = wrapelement;
  iVar1 = TPZGeoElSide::Dimension(&local_1e0);
  local_200 = wrapelement;
  if (local_1e0.fGeoEl == (TPZGeoEl *)0x0) {
    local_220._8_8_ = &PTR__TPZGeoElSide_018f8760;
    local_210 = (TPZGeoEl *)0x0;
    local_208 = -1;
    pTVar5 = (TPZGeoEl *)0x0;
  }
  else {
    (**(code **)(*(long *)local_1e0.fGeoEl + 0x188))(local_220 + 8,local_1e0.fGeoEl,local_1e0.fSide)
    ;
    pTVar5 = local_1e0.fGeoEl;
  }
  if ((local_210 != pTVar5) || (local_208 != local_1e0.fSide)) {
    do {
      iVar2 = (**(code **)(*(long *)local_210 + 0x1d0))();
      if ((iVar2 != 0) &&
         (iVar2 = TPZGeoElSide::NSubElements((TPZGeoElSide *)(local_220 + 8)), 1 < iVar2)) {
        lVar4 = 0x30;
        do {
          *(undefined ***)
           ((long)(local_140.super_TPZManVector<TPZGeoElSide,_10>.fExtAlloc + -2) + lVar4) =
               &PTR__TPZGeoElSide_018f8760;
          *(undefined8 *)
           ((long)local_140.super_TPZManVector<TPZGeoElSide,_10>.fExtAlloc + lVar4 + -0x28) = 0;
          *(undefined4 *)
           ((long)local_140.super_TPZManVector<TPZGeoElSide,_10>.fExtAlloc + lVar4 + -0x20) =
               0xffffffff;
          lVar4 = lVar4 + 0x18;
        } while (lVar4 != 0x120);
        local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fStore =
             local_140.super_TPZManVector<TPZGeoElSide,_10>.fExtAlloc;
        local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fNElements = 0;
        local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fNAlloc = 0;
        local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>._vptr_TPZVec =
             (_func_int **)&PTR__TPZManVector_0181a6d0;
        TPZGeoElSide::GetSubElements2((TPZGeoElSide *)(local_220 + 8),&local_140);
        if (0 < (int)(uint)local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>
                           .fNElements) {
          uVar6 = (ulong)((uint)local_140.super_TPZManVector<TPZGeoElSide,_10>.
                                super_TPZVec<TPZGeoElSide>.fNElements & 0x7fffffff);
          lVar4 = 0;
          iVar7 = 0;
          iVar2 = 0;
          do {
            iVar3 = TPZGeoElSide::Dimension
                              ((TPZGeoElSide *)
                               ((long)&((local_140.super_TPZManVector<TPZGeoElSide,_10>.
                                         super_TPZVec<TPZGeoElSide>.fStore)->super_TPZSavable).
                                       _vptr_TPZSavable + lVar4));
            if (iVar3 == iVar1) {
              local_158.super_TPZSavable._vptr_TPZSavable =
                   (_func_int **)&PTR__TPZGeoElSide_018f8760;
              local_158.fSide =
                   *(int *)((long)&(local_140.super_TPZManVector<TPZGeoElSide,_10>.
                                    super_TPZVec<TPZGeoElSide>.fStore)->fSide + lVar4);
              local_158.fGeoEl =
                   *(TPZGeoEl **)
                    ((long)&(local_140.super_TPZManVector<TPZGeoElSide,_10>.
                             super_TPZVec<TPZGeoElSide>.fStore)->fGeoEl + lVar4);
              iVar3 = HasWrapNeighbour(local_1f8,&local_158);
              iVar7 = iVar7 + 1;
              iVar2 = (iVar2 + 1) - (uint)(iVar3 == 0);
            }
            lVar4 = lVar4 + 0x18;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
          if (iVar2 != iVar7 && iVar2 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"I don\'t understand\n",0x13);
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                       ,0x9fd);
          }
          if (iVar2 != 0) goto LAB_0139ed3f;
        }
        iVar1 = local_208;
        iVar2 = TPZGeoElSide::NSides((TPZGeoElSide *)(local_220 + 8));
        if (iVar1 == iVar2 + -1) {
          (**(code **)(*(long *)local_210 + 0x2b0))(&local_1c8);
          pTVar5 = local_200;
          if (((TPZReference *)local_1c8._M_allocated_capacity == (TPZReference *)0x0) ||
             (*(undefined **)local_1c8._M_allocated_capacity == (undefined *)0x0)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"void TPZMHMeshControl::DivideWrap(TPZGeoEl *)",0x2d);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout," We expect elements to have refinement patterns\n",
                       0x30);
          }
          else {
            local_1e8.fRef = (TPZReference *)local_1c8._M_allocated_capacity;
            LOCK();
            ((atomic_int *)(local_1c8._M_allocated_capacity + 8))->super___atomic_base<int> =
                 (__atomic_base<int>)
                 ((__int_type)
                  ((atomic_int *)(local_1c8._M_allocated_capacity + 8))->super___atomic_base<int> +
                 1);
            UNLOCK();
            (**(code **)(*(long *)local_200 + 0x2a8))(local_200);
            this_00 = &local_1e8;
LAB_0139ec56:
            TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(this_00);
          }
        }
        else {
          (**(code **)(*(long *)local_210 + 0x2b0))(&local_1c8);
          pTVar5 = local_200;
          if (((TPZReference *)local_1c8._M_allocated_capacity != (TPZReference *)0x0) &&
             (*(undefined **)local_1c8._M_allocated_capacity != (undefined *)0x0)) {
            TPZRefPattern::SideRefPattern
                      ((TPZRefPattern *)local_220,
                       (int)*(undefined **)local_1c8._M_allocated_capacity);
            if (((_func_int **)local_220._0_8_ == (_func_int **)0x0) ||
               (*(_func_int **)local_220._0_8_ == (_func_int *)0x0)) {
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                         ,0xa17);
            }
            local_1f0.fRef = (TPZReference *)local_220._0_8_;
            LOCK();
            *(int *)(local_220._0_8_ + 8) = *(int *)(local_220._0_8_ + 8) + 1;
            UNLOCK();
            (**(code **)(*(long *)pTVar5 + 0x2a8))(pTVar5);
            TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(&local_1f0);
            this_00 = (TPZAutoPointer<TPZRefPattern> *)local_220;
            goto LAB_0139ec56;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"void TPZMHMeshControl::DivideWrap(TPZGeoEl *)",0x2d);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout," We expect elements to have refinement patterns\n",0x30)
          ;
        }
        TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)&local_1c8);
        TPZStack<TPZGeoEl_*,_10>::TPZStack((TPZStack<TPZGeoEl_*,_10> *)&local_1c8);
        (**(code **)(*(long *)pTVar5 + 0x1c0))(pTVar5,&local_1c8);
        if (0 < local_1b8) {
          lVar4 = 0;
          do {
            DivideWrap(local_1f8,*(TPZGeoEl **)(local_1c8._8_8_ + lVar4 * 8));
            lVar4 = lVar4 + 1;
          } while (lVar4 < local_1b8);
        }
        if ((undefined1 *)local_1c8._8_8_ != local_1a8) {
          local_1b0 = (_func_int **)0x0;
          local_1c8._M_allocated_capacity = (size_type)&PTR__TPZVec_018140b0;
          if ((undefined1 *)local_1c8._8_8_ != (undefined1 *)0x0) {
            operator_delete__((void *)local_1c8._8_8_);
          }
        }
LAB_0139ed3f:
        if (local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fStore ==
            local_140.super_TPZManVector<TPZGeoElSide,_10>.fExtAlloc) {
          return;
        }
        local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fNAlloc = 0;
        local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>._vptr_TPZVec =
             (_func_int **)&PTR__TPZVec_018141b0;
        if (local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fStore ==
            (TPZGeoElSide *)0x0) {
          return;
        }
        operator_delete__(&local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>
                           .fStore[-1].fSide,
                          *(long *)&local_140.super_TPZManVector<TPZGeoElSide,_10>.
                                    super_TPZVec<TPZGeoElSide>.fStore[-1].fSide * 0x18 + 8);
        return;
      }
      if (local_210 == (TPZGeoEl *)0x0) {
        local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>._vptr_TPZVec =
             (_func_int **)&PTR__TPZGeoElSide_018f8760;
        local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fStore =
             (TPZGeoElSide *)0x0;
        local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fNElements =
             CONCAT44(local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.
                      fNElements._4_4_,0xffffffff);
      }
      else {
        (**(code **)(*(long *)local_210 + 0x188))(&local_140,local_210,local_208);
      }
      local_208 = (int)local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.
                       fNElements;
      local_210 = (TPZGeoEl *)
                  local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fStore;
    } while (((TPZGeoEl *)
              local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fStore !=
              local_1e0.fGeoEl) ||
            ((int)local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.
                  fNElements != local_1e0.fSide));
  }
  return;
}

Assistant:

void TPZMHMeshControl::DivideWrap(TPZGeoEl *wrapelement)
{
    TPZGeoElSide gelside(wrapelement, wrapelement->NSides()-1);
    int dim = gelside.Dimension();
    TPZGeoElSide neighbour = gelside.Neighbour();
    while (neighbour != gelside) {
        if(neighbour.Element()->HasSubElement() && neighbour.NSubElements() > 1)
        {
            // verify if the subelements are connected to a wrap element
            TPZStack<TPZGeoElSide> subelsides;
            neighbour.GetSubElements2(subelsides);
            int nsub = subelsides.size();
            int nwrap = 0;
            int nsidesdim = 0;
            for(int isub = 0; isub<nsub; isub++)
            {
                if(subelsides[isub].Dimension() == dim)
                {
                    nsidesdim++;
                }
                else continue;
                if(HasWrapNeighbour(subelsides[isub])) nwrap++;
            }
            if(nwrap != 0 && nwrap != nsidesdim)
            {
                std::cout << "I don't understand\n";
                DebugStop();
            }
            if(nwrap != 0) return;
            if (neighbour.Side() == neighbour.NSides()-1) {
                TPZAutoPointer<TPZRefPattern> siderefpattern = neighbour.Element()->GetRefPattern();
                if(!siderefpattern)
                {
                    std::cout << __PRETTY_FUNCTION__ << " We expect elements to have refinement patterns\n";
//                    DebugStop();
                }
                else
                {
                    wrapelement->SetRefPattern(siderefpattern);
                }
            }
            else
            {
                TPZAutoPointer<TPZRefPattern> elrefpattern = neighbour.Element()->GetRefPattern();
                if(!elrefpattern)
                {
                    std::cout << __PRETTY_FUNCTION__ << " We expect elements to have refinement patterns\n";
//                    DebugStop();
                }
                else
                {
                    TPZAutoPointer<TPZRefPattern> siderefpattern = elrefpattern->SideRefPattern(neighbour.Side());
                    if(!siderefpattern) DebugStop();
                    wrapelement->SetRefPattern(siderefpattern);
                }
            }
            TPZStack<TPZGeoEl *> subels;

            wrapelement->Divide(subels);
#ifdef PZDEBUG
            if(subels.size() == 1)
            {
                DebugStop();
            }
#endif
#ifdef PZ_LOG
            if(loggerWRAP.isDebugEnabled())
            {
                std::stringstream sout;
                sout << std::endl;
                for (int is=0; is<subels.size(); is++) {
                    sout << "Created a son wrap element of " << wrapelement->Index() <<
                    " matid " << wrapelement->MaterialId() << " with index " <<
                    subels[is]->Index() << std::endl;
                }
                LOGPZ_DEBUG(loggerWRAP, sout.str())
            }
#endif
            for (int is=0; is<subels.size(); is++) {
                DivideWrap(subels[is]);
            }
            break;
        }
        neighbour = neighbour.Neighbour();
    }
}